

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::AdvancedLargeStrideAndOffsetsNewAndLegacyAPI::Run
          (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *this)

{
  bool bVar1;
  GLuint GVar2;
  size_type size;
  reference data_00;
  Vector<float,_2> *v;
  CallLogWrapper *this_00;
  float i1_v1_a3;
  float i1_v0_a3;
  float i0_v1_a3;
  float i0_v0_a3;
  Vector<unsigned_int,_2> local_1ac;
  Vector<unsigned_int,_2> local_1a4;
  Vector<unsigned_int,_2> local_19c;
  Vector<unsigned_int,_2> local_194;
  Vector<unsigned_int,_2> local_18c;
  Vector<unsigned_int,_2> local_184;
  Vector<unsigned_int,_2> local_17c;
  Vector<unsigned_int,_2> local_174;
  UVec2 i1_v1_a2;
  UVec2 i1_v0_a2;
  UVec2 i0_v1_a2;
  UVec2 i0_v0_a2;
  Vector<int,_2> local_14c;
  Vector<int,_2> local_144;
  Vector<int,_2> local_13c;
  Vector<int,_2> local_134;
  Vector<int,_2> local_12c;
  Vector<int,_2> local_124;
  Vector<int,_2> local_11c;
  Vector<int,_2> local_114;
  IVec2 i1_v1_a1;
  IVec2 i1_v0_a1;
  IVec2 i0_v1_a1;
  IVec2 i0_v0_a1;
  Vector<float,_2> local_ec;
  Vector<float,_2> local_e4;
  Vector<float,_2> local_dc;
  Vector<float,_2> local_d4;
  Vector<float,_2> local_cc;
  undefined4 local_c4;
  Vector<float,_2> local_c0;
  Vector<float,_2> local_b8;
  Vector<float,_2> local_b0;
  Vec2 i1_v1_a0;
  Vec2 i1_v0_a0;
  Vec2 i0_v1_a0;
  Vec2 i0_v0_a0;
  GLubyte *ptr_1;
  allocator<unsigned_char> local_72;
  value_type_conflict5 local_71;
  undefined1 local_70 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  Vector<unsigned_int,_2> local_50;
  Vector<int,_2> local_48;
  Vector<int,_2> local_40;
  Vector<float,_2> local_38;
  Vector<float,_2> local_30;
  void *local_28;
  GLubyte *ptr;
  char *glsl_vs;
  AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *this_local;
  
  ptr = 
  "#version 430 core\nlayout(location = 0) in vec2 vs_in_attrib0;\nlayout(location = 4) in ivec2 vs_in_attrib1;\nlayout(location = 8) in uvec2 vs_in_attrib2;\nlayout(location = 15) in float vs_in_attrib3;\nlayout(std430, binding = 1) buffer Output {\n  vec2 attrib0[4];\n  ivec2 attrib1[4];\n  uvec2 attrib2[4];\n  float attrib3[4];\n} g_output;\nvoid main() {\n  g_output.attrib0[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib0;\n  g_output.attrib1[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib1;\n  g_output.attrib2[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib2;\n  g_output.attrib3[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib3;\n}"
  ;
  glsl_vs = (char *)this;
  GVar2 = glu::CallLogWrapper::glCreateShaderProgramv
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x8b31,1,(GLchar **)&ptr);
  this->m_vsp = GVar2;
  bVar1 = VertexAttribBindingBase::CheckProgram(&this->super_VertexAttribBindingBase,this->m_vsp);
  if (bVar1) {
    this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glUseProgramStages(this_00,this->m_ppo,1,this->m_vsp);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo);
    glu::CallLogWrapper::glBufferData(this_00,0x8892,100000,(void *)0x0,0x88e4);
    local_28 = glu::CallLogWrapper::glMapBuffer(this_00,0x8892,0x88b9);
    tcu::Vector<float,_2>::Vector(&local_30,1.0,2.0);
    *(float (*) [2])((long)local_28 + 0x10) = local_30.m_data;
    tcu::Vector<float,_2>::Vector(&local_38,3.0,4.0);
    *(float (*) [2])((long)local_28 + 0x810) = local_38.m_data;
    tcu::Vector<int,_2>::Vector(&local_40,5,6);
    *(int (*) [2])((long)local_28 + 0x80) = local_40.m_data;
    tcu::Vector<int,_2>::Vector(&local_48,7,8);
    *(int (*) [2])((long)local_28 + 0x880) = local_48.m_data;
    tcu::Vector<unsigned_int,_2>::Vector(&local_50,9,10);
    *(uint (*) [2])((long)local_28 + 0x400) = local_50.m_data;
    tcu::Vector<unsigned_int,_2>::Vector
              ((Vector<unsigned_int,_2> *)
               &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0xb,0xc);
    *(pointer *)((long)local_28 + 0xc00) =
         data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    *(undefined4 *)((long)local_28 + 0x7f0) = 0x41500000;
    *(undefined4 *)((long)local_28 + 0xff0) = 0x41600000;
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x8892);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
    glu::CallLogWrapper::glVertexAttribFormat(this_00,0,2,0x1406,'\0',0x10);
    glu::CallLogWrapper::glVertexAttribIFormat(this_00,8,2,0x1405,0x400);
    glu::CallLogWrapper::glVertexAttribFormat(this_00,0xf,1,0x1406,'\0',0x7f0);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo);
    glu::CallLogWrapper::glVertexAttribIPointer(this_00,4,2,0x1404,0x800,(void *)0x80);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
    glu::CallLogWrapper::glVertexAttribBinding(this_00,8,3);
    glu::CallLogWrapper::glVertexAttribBinding(this_00,0xf,3);
    glu::CallLogWrapper::glBindVertexBuffer(this_00,0,this->m_vbo,0,0x800);
    glu::CallLogWrapper::glBindVertexBuffer(this_00,3,this->m_vbo,0,0x800);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,4);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,8);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0xf);
    glu::CallLogWrapper::glBindVertexArray(this_00,0);
    local_71 = 0xff;
    std::allocator<unsigned_char>::allocator(&local_72);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,0x70,&local_71,
               &local_72);
    std::allocator<unsigned_char>::~allocator(&local_72);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,1,this->m_ssbo);
    size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
    data_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,size,data_00,0x88e8);
    glu::CallLogWrapper::glEnable
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c89);
    glu::CallLogWrapper::glBindProgramPipeline
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_ppo);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_vao);
    glu::CallLogWrapper::glDrawArraysInstanced
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,0,2,2);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,this->m_ssbo);
    v = (Vector<float,_2> *)
        glu::CallLogWrapper::glMapBuffer
                  (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,35000);
    tcu::Vector<float,_2>::Vector(&i0_v1_a0,v);
    tcu::Vector<float,_2>::Vector(&i1_v0_a0,v + 1);
    tcu::Vector<float,_2>::Vector(&i1_v1_a0,v + 2);
    tcu::Vector<float,_2>::Vector(&local_b0,v + 3);
    tcu::Vector<float,_2>::Vector(&local_b8,&i0_v1_a0);
    tcu::Vector<float,_2>::Vector(&local_c0,1.0,2.0);
    bVar1 = VertexAttribBindingBase::IsEqual
                      (&this->super_VertexAttribBindingBase,&local_b8,&local_c0);
    if (bVar1) {
      tcu::Vector<float,_2>::Vector(&local_cc,&i1_v0_a0);
      tcu::Vector<float,_2>::Vector(&local_d4,3.0,4.0);
      bVar1 = VertexAttribBindingBase::IsEqual
                        (&this->super_VertexAttribBindingBase,&local_cc,&local_d4);
      if (bVar1) {
        tcu::Vector<float,_2>::Vector(&local_dc,&i1_v1_a0);
        tcu::Vector<float,_2>::Vector(&local_e4,1.0,2.0);
        bVar1 = VertexAttribBindingBase::IsEqual
                          (&this->super_VertexAttribBindingBase,&local_dc,&local_e4);
        if (bVar1) {
          tcu::Vector<float,_2>::Vector(&local_ec,&local_b0);
          tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&i0_v0_a1,3.0,4.0);
          bVar1 = VertexAttribBindingBase::IsEqual
                            (&this->super_VertexAttribBindingBase,&local_ec,(Vec2 *)&i0_v0_a1);
          if (bVar1) {
            tcu::Vector<int,_2>::Vector(&i0_v1_a1,(Vector<int,_2> *)(v + 4));
            tcu::Vector<int,_2>::Vector(&i1_v0_a1,(Vector<int,_2> *)(v + 5));
            tcu::Vector<int,_2>::Vector(&i1_v1_a1,(Vector<int,_2> *)(v + 6));
            tcu::Vector<int,_2>::Vector(&local_114,(Vector<int,_2> *)(v + 7));
            tcu::Vector<int,_2>::Vector(&local_11c,&i0_v1_a1);
            tcu::Vector<int,_2>::Vector(&local_124,5,6);
            bVar1 = VertexAttribBindingBase::IsEqual
                              (&this->super_VertexAttribBindingBase,&local_11c,&local_124);
            if (bVar1) {
              tcu::Vector<int,_2>::Vector(&local_12c,&i1_v0_a1);
              tcu::Vector<int,_2>::Vector(&local_134,7,8);
              bVar1 = VertexAttribBindingBase::IsEqual
                                (&this->super_VertexAttribBindingBase,&local_12c,&local_134);
              if (bVar1) {
                tcu::Vector<int,_2>::Vector(&local_13c,&i1_v1_a1);
                tcu::Vector<int,_2>::Vector(&local_144,5,6);
                bVar1 = VertexAttribBindingBase::IsEqual
                                  (&this->super_VertexAttribBindingBase,&local_13c,&local_144);
                if (bVar1) {
                  tcu::Vector<int,_2>::Vector(&local_14c,&local_114);
                  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&i0_v0_a2,7,8);
                  bVar1 = VertexAttribBindingBase::IsEqual
                                    (&this->super_VertexAttribBindingBase,&local_14c,
                                     (IVec2 *)&i0_v0_a2);
                  if (bVar1) {
                    tcu::Vector<unsigned_int,_2>::Vector
                              (&i0_v1_a2,(Vector<unsigned_int,_2> *)(v + 8));
                    tcu::Vector<unsigned_int,_2>::Vector
                              (&i1_v0_a2,(Vector<unsigned_int,_2> *)(v + 9));
                    tcu::Vector<unsigned_int,_2>::Vector
                              (&i1_v1_a2,(Vector<unsigned_int,_2> *)(v + 10));
                    tcu::Vector<unsigned_int,_2>::Vector
                              (&local_174,(Vector<unsigned_int,_2> *)(v + 0xb));
                    tcu::Vector<unsigned_int,_2>::Vector(&local_17c,&i0_v1_a2);
                    tcu::Vector<unsigned_int,_2>::Vector(&local_184,9,10);
                    bVar1 = VertexAttribBindingBase::IsEqual
                                      (&this->super_VertexAttribBindingBase,&local_17c,&local_184);
                    if (bVar1) {
                      tcu::Vector<unsigned_int,_2>::Vector(&local_18c,&i1_v0_a2);
                      tcu::Vector<unsigned_int,_2>::Vector(&local_194,0xb,0xc);
                      bVar1 = VertexAttribBindingBase::IsEqual
                                        (&this->super_VertexAttribBindingBase,&local_18c,&local_194)
                      ;
                      if (bVar1) {
                        tcu::Vector<unsigned_int,_2>::Vector(&local_19c,&i1_v1_a2);
                        tcu::Vector<unsigned_int,_2>::Vector(&local_1a4,9,10);
                        bVar1 = VertexAttribBindingBase::IsEqual
                                          (&this->super_VertexAttribBindingBase,&local_19c,
                                           &local_1a4);
                        if (bVar1) {
                          tcu::Vector<unsigned_int,_2>::Vector(&local_1ac,&local_174);
                          tcu::Vector<unsigned_int,_2>::Vector
                                    ((Vector<unsigned_int,_2> *)&i0_v1_a3,0xb,0xc);
                          bVar1 = VertexAttribBindingBase::IsEqual
                                            (&this->super_VertexAttribBindingBase,&local_1ac,
                                             (UVec2 *)&i0_v1_a3);
                          if (bVar1) {
                            if ((v[0xc].m_data[0] != 13.0) || (NAN(v[0xc].m_data[0]))) {
                              this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)
                                           &DAT_ffffffffffffffff;
                            }
                            else if ((v[0xc].m_data[1] != 14.0) || (NAN(v[0xc].m_data[1]))) {
                              this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)
                                           &DAT_ffffffffffffffff;
                            }
                            else if ((v[0xd].m_data[0] != 13.0) || (NAN(v[0xd].m_data[0]))) {
                              this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)
                                           &DAT_ffffffffffffffff;
                            }
                            else if ((v[0xd].m_data[1] != 14.0) || (NAN(v[0xd].m_data[1]))) {
                              this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)
                                           &DAT_ffffffffffffffff;
                            }
                            else {
                              glu::CallLogWrapper::glUnmapBuffer
                                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.
                                          super_GLWrapper.super_CallLogWrapper,0x90d2);
                              this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)0x0;
                            }
                          }
                          else {
                            this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)
                                         &DAT_ffffffffffffffff;
                          }
                        }
                        else {
                          this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)
                                       &DAT_ffffffffffffffff;
                        }
                      }
                      else {
                        this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)
                                     &DAT_ffffffffffffffff;
                      }
                    }
                    else {
                      this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)
                                   &DAT_ffffffffffffffff;
                    }
                  }
                  else {
                    this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)
                                 &DAT_ffffffffffffffff;
                  }
                }
                else {
                  this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)&DAT_ffffffffffffffff
                  ;
                }
              }
              else {
                this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)&DAT_ffffffffffffffff;
              }
            }
            else {
              this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)&DAT_ffffffffffffffff;
            }
          }
          else {
            this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)&DAT_ffffffffffffffff;
          }
        }
        else {
          this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)&DAT_ffffffffffffffff;
    }
    local_c4 = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
  }
  else {
    this_local = (AdvancedLargeStrideAndOffsetsNewAndLegacyAPI *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs =
			"#version 430 core" NL "layout(location = 0) in vec2 vs_in_attrib0;" NL
			"layout(location = 4) in ivec2 vs_in_attrib1;" NL "layout(location = 8) in uvec2 vs_in_attrib2;" NL
			"layout(location = 15) in float vs_in_attrib3;" NL "layout(std430, binding = 1) buffer Output {" NL
			"  vec2 attrib0[4];" NL "  ivec2 attrib1[4];" NL "  uvec2 attrib2[4];" NL "  float attrib3[4];" NL
			"} g_output;" NL "void main() {" NL
			"  g_output.attrib0[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib0;" NL
			"  g_output.attrib1[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib1;" NL
			"  g_output.attrib2[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib2;" NL
			"  g_output.attrib3[2 * gl_InstanceID + gl_VertexID] = vs_in_attrib3;" NL "}";
		m_vsp = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
		if (!CheckProgram(m_vsp))
			return ERROR;
		glUseProgramStages(m_ppo, GL_VERTEX_SHADER_BIT, m_vsp);

		{
			glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
			glBufferData(GL_ARRAY_BUFFER, 100000, NULL, GL_STATIC_DRAW);
			GLubyte* ptr = static_cast<GLubyte*>(glMapBuffer(GL_ARRAY_BUFFER, GL_WRITE_ONLY));

			*reinterpret_cast<Vec2*>(&ptr[16 + 0 * 2048])	= Vec2(1.0f, 2.0f);
			*reinterpret_cast<Vec2*>(&ptr[16 + 1 * 2048])	= Vec2(3.0f, 4.0f);
			*reinterpret_cast<IVec2*>(&ptr[128 + 0 * 2048])  = IVec2(5, 6);
			*reinterpret_cast<IVec2*>(&ptr[128 + 1 * 2048])  = IVec2(7, 8);
			*reinterpret_cast<UVec2*>(&ptr[1024 + 0 * 2048]) = UVec2(9, 10);
			*reinterpret_cast<UVec2*>(&ptr[1024 + 1 * 2048]) = UVec2(11, 12);
			*reinterpret_cast<float*>(&ptr[2032 + 0 * 2048]) = 13.0f;
			*reinterpret_cast<float*>(&ptr[2032 + 1 * 2048]) = 14.0f;

			glUnmapBuffer(GL_ARRAY_BUFFER);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}
		glBindVertexArray(m_vao);
		glVertexAttribFormat(0, 2, GL_FLOAT, GL_FALSE, 16);
		glVertexAttribIFormat(8, 2, GL_UNSIGNED_INT, 1024);
		glVertexAttribFormat(15, 1, GL_FLOAT, GL_FALSE, 2032);
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glVertexAttribIPointer(4, 2, GL_INT, 2048, reinterpret_cast<void*>(128));
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glVertexAttribBinding(8, 3);
		glVertexAttribBinding(15, 3);
		glBindVertexBuffer(0, m_vbo, 0, 2048);
		glBindVertexBuffer(3, m_vbo, 0, 2048);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(4);
		glEnableVertexAttribArray(8);
		glEnableVertexAttribArray(15);
		glBindVertexArray(0);

		std::vector<GLubyte> data((sizeof(Vec2) + sizeof(IVec2) + sizeof(UVec2) + sizeof(float)) * 4, 0xff);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_ssbo);
		glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)data.size(), &data[0], GL_DYNAMIC_DRAW);

		glEnable(GL_RASTERIZER_DISCARD);
		glBindProgramPipeline(m_ppo);
		glBindVertexArray(m_vao);
		glDrawArraysInstanced(GL_POINTS, 0, 2, 2);

		{
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
			GLubyte* ptr = static_cast<GLubyte*>(glMapBuffer(GL_SHADER_STORAGE_BUFFER, GL_READ_ONLY));

			Vec2 i0_v0_a0 = *reinterpret_cast<Vec2*>(&ptr[0]);
			Vec2 i0_v1_a0 = *reinterpret_cast<Vec2*>(&ptr[8]);
			Vec2 i1_v0_a0 = *reinterpret_cast<Vec2*>(&ptr[16]);
			Vec2 i1_v1_a0 = *reinterpret_cast<Vec2*>(&ptr[24]);

			if (!IsEqual(i0_v0_a0, Vec2(1.0f, 2.0f)))
				return ERROR;
			if (!IsEqual(i0_v1_a0, Vec2(3.0f, 4.0f)))
				return ERROR;
			if (!IsEqual(i1_v0_a0, Vec2(1.0f, 2.0f)))
				return ERROR;
			if (!IsEqual(i1_v1_a0, Vec2(3.0f, 4.0f)))
				return ERROR;

			IVec2 i0_v0_a1 = *reinterpret_cast<IVec2*>(&ptr[32]);
			IVec2 i0_v1_a1 = *reinterpret_cast<IVec2*>(&ptr[40]);
			IVec2 i1_v0_a1 = *reinterpret_cast<IVec2*>(&ptr[48]);
			IVec2 i1_v1_a1 = *reinterpret_cast<IVec2*>(&ptr[56]);

			if (!IsEqual(i0_v0_a1, IVec2(5, 6)))
				return ERROR;
			if (!IsEqual(i0_v1_a1, IVec2(7, 8)))
				return ERROR;
			if (!IsEqual(i1_v0_a1, IVec2(5, 6)))
				return ERROR;
			if (!IsEqual(i1_v1_a1, IVec2(7, 8)))
				return ERROR;

			UVec2 i0_v0_a2 = *reinterpret_cast<UVec2*>(&ptr[64]);
			UVec2 i0_v1_a2 = *reinterpret_cast<UVec2*>(&ptr[72]);
			UVec2 i1_v0_a2 = *reinterpret_cast<UVec2*>(&ptr[80]);
			UVec2 i1_v1_a2 = *reinterpret_cast<UVec2*>(&ptr[88]);

			if (!IsEqual(i0_v0_a2, UVec2(9, 10)))
				return ERROR;
			if (!IsEqual(i0_v1_a2, UVec2(11, 12)))
				return ERROR;
			if (!IsEqual(i1_v0_a2, UVec2(9, 10)))
				return ERROR;
			if (!IsEqual(i1_v1_a2, UVec2(11, 12)))
				return ERROR;

			float i0_v0_a3 = *reinterpret_cast<float*>(&ptr[96]);
			float i0_v1_a3 = *reinterpret_cast<float*>(&ptr[100]);
			float i1_v0_a3 = *reinterpret_cast<float*>(&ptr[104]);
			float i1_v1_a3 = *reinterpret_cast<float*>(&ptr[108]);

			if (i0_v0_a3 != 13.0f)
				return ERROR;
			if (i0_v1_a3 != 14.0f)
				return ERROR;
			if (i1_v0_a3 != 13.0f)
				return ERROR;
			if (i1_v1_a3 != 14.0f)
				return ERROR;
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		return NO_ERROR;
	}